

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleParameters::MergeFrom
          (TreeEnsembleParameters *this,TreeEnsembleParameters *from)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x444);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
            (&(this->nodes_).super_RepeatedPtrFieldBase,&(from->nodes_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::MergeFrom
            (&this->basepredictionvalue_,&from->basepredictionvalue_);
  if (from->numpredictiondimensions_ != 0) {
    this->numpredictiondimensions_ = from->numpredictiondimensions_;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleParameters::MergeFrom(const TreeEnsembleParameters& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleParameters)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  nodes_.MergeFrom(from.nodes_);
  basepredictionvalue_.MergeFrom(from.basepredictionvalue_);
  if (from._internal_numpredictiondimensions() != 0) {
    _internal_set_numpredictiondimensions(from._internal_numpredictiondimensions());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}